

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering_Equality.cpp
# Opt level: O3

Result __thiscall
Kernel::Ordering::compare_s1It1(Ordering *this,TermList s1,TermList s2,TermList t1,TermList t2)

{
  int iVar1;
  Result RVar2;
  undefined *puVar3;
  
  iVar1 = (*this->_vptr_Ordering[3])(this,s2._content,t2._content);
  if (iVar1 != 4) {
    if (iVar1 == 2) {
      iVar1 = (*this->_vptr_Ordering[3])(this,t2._content,s1._content);
      puVar3 = &DAT_008fa28c;
    }
    else {
      iVar1 = (*this->_vptr_Ordering[3])(this,s2._content,t1._content);
      puVar3 = &DAT_008fa29c;
    }
    return *(Result *)(puVar3 + (long)iVar1 * 4 + -4);
  }
  RVar2 = compare_s1It1_s2It2(this,s1,s2,t1,t2);
  return RVar2;
}

Assistant:

Ordering::Result Ordering::compare_s1It1(TermList s1,TermList s2,TermList t1,TermList t2) const
{
  ASS_EQ(compare(s1,t1), INCOMPARABLE);

  switch(compare(s2,t2)) {
  case GREATER:
    return compare_s1Gt1_s2It2(s2,s1,t2,t1);
  case INCOMPARABLE:
    return compare_s1It1_s2It2(s1,s2,t1,t2);
  case LESS:
    return reverse(compare_s1Gt1_s2It2(t2,t1,s2,s1));
  default:
    ASSERTION_VIOLATION;
  }
}